

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

bool __thiscall SimpleString::endsWith(SimpleString *this,SimpleString *other)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  undefined8 *in_RSI;
  long *in_RDI;
  size_t other_buffer_length;
  size_t buffer_length;
  undefined1 local_1;
  
  sVar2 = size((SimpleString *)0x20aa2d);
  sVar3 = StrLen((char *)*in_RSI);
  if (sVar3 == 0) {
    local_1 = true;
  }
  else if (sVar2 == 0) {
    local_1 = false;
  }
  else if (sVar2 < sVar3) {
    local_1 = false;
  }
  else {
    iVar1 = StrCmp((char *)((*in_RDI + sVar2) - sVar3),(char *)*in_RSI);
    local_1 = iVar1 == 0;
  }
  return local_1;
}

Assistant:

bool SimpleString::endsWith(const SimpleString& other) const
{
    size_t buffer_length = size();
    size_t other_buffer_length = StrLen(other.buffer_);
    if (other_buffer_length == 0) return true;
    if (buffer_length == 0) return false;
    if (buffer_length < other_buffer_length) return false;
    return StrCmp(buffer_ + buffer_length - other_buffer_length, other.buffer_) == 0;
}